

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall
tchecker::system::system_builder_t::visit(system_builder_t *this,system_declaration_t *d)

{
  __normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>
  __r;
  range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>_>
  rVar1;
  shared_ptr<tchecker::parsing::declaration_t> decl;
  long *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  rVar1 = parsing::system_declaration_t::declarations(d);
  for (__r = rVar1._begin._M_current; __r._M_current != rVar1._end._M_current._M_current;
      __r._M_current =
           (shared_ptr<tchecker::parsing::inner_declaration_t> *)
           (&(__r._M_current)->
             super___shared_ptr<tchecker::parsing::inner_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           + 1)) {
    std::__shared_ptr<tchecker::parsing::declaration_t,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::parsing::inner_declaration_t,void>
              ((__shared_ptr<tchecker::parsing::declaration_t,(__gnu_cxx::_Lock_policy)2> *)
               &local_38,
               &(__r._M_current)->
                super___shared_ptr<tchecker::parsing::inner_declaration_t,_(__gnu_cxx::_Lock_policy)2>
              );
    (**(code **)(*local_38 + 0x10))(local_38,this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  }
  return;
}

Assistant:

virtual void visit(tchecker::parsing::system_declaration_t const & d)
  {
    for (std::shared_ptr<tchecker::parsing::declaration_t> const decl : d.declarations())
      decl->visit(*this);
  }